

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O2

void ronanCBProcess(syWRonan *wsptr,float *buf,uint32_t len)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  syVRonan deltaframe;
  float local_d8;
  float afStack_94 [25];
  
  for (lVar3 = 0; lVar3 != 0x19; lVar3 = lVar3 + 1) {
    afStack_94[lVar3] =
         ((&(wsptr->newframe).rdef[0].a)[lVar3] - (&(wsptr->super_syVRonan).rdef[0].a)[lVar3]) *
         (1.0 / (float)len);
  }
  for (uVar5 = 0; uVar5 != len; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x19; lVar3 = lVar3 + 1) {
      (&(wsptr->super_syVRonan).rdef[0].a)[lVar3] =
           afStack_94[lVar3] + (&(wsptr->super_syVRonan).rdef[0].a)[lVar3];
    }
    uVar4 = (ulong)(uint)((int)uVar5 * 2);
    fVar7 = buf[uVar4];
    fVar8 = (wsptr->super_syVRonan).a_voicing;
    fVar6 = Ronan::syWRonan::noise(wsptr);
    fVar7 = fVar6 * (wsptr->super_syVRonan).a_aspiration + fVar7 * fVar8;
    fVar8 = Ronan::Resonator::tick(wsptr->res,fVar7);
    local_d8 = Ronan::Resonator::tick(wsptr->res + 1,fVar7);
    local_d8 = local_d8 + fVar8;
    fVar8 = Ronan::syWRonan::noise(wsptr);
    fVar8 = (fVar8 * (wsptr->super_syVRonan).a_frication + fVar7) - wsptr->lastin2;
    wsptr->lastin2 = fVar7;
    for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 0x10) {
      fVar7 = Ronan::Resonator::tick((Resonator *)((long)&wsptr->res[2].def + lVar3),fVar8);
      local_d8 = fVar7 - local_d8;
    }
    uVar1 = wsptr->hpb1;
    uVar2 = wsptr->hpb2;
    fVar7 = (fVar8 * (wsptr->super_syVRonan).a_bypass - local_d8) - (float)uVar1;
    fVar8 = fVar7 - (float)uVar2;
    wsptr->hpb1 = fVar7 * 0.012 + (float)uVar1;
    wsptr->hpb2 = fVar8 * 0.012 + (float)uVar2;
    fVar7 = Ronan::Resonator::tick(&wsptr->peq1,fVar8);
    buf[uVar4 + 1] = fVar7 - fVar8;
    buf[uVar4] = fVar7 - fVar8;
  }
  return;
}

Assistant:

void ronanCBProcess(syWRonan *wsptr, float *buf, uint32_t len)
{
    syVRonan deltaframe;

    // prepare interpolation
    {
        float *src1 = (float*)wsptr;
        float *src2 = (float*)&wsptr->newframe;
        float *dest = (float*)&deltaframe;
        float mul   = 1.0f/(float)len;
        for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
            dest[i] = (src2[i] - src1[i])*mul;
    }

    for (uint32_t i = 0; i < len; i++)
    {
        // interpolate all values
        {
            float *src  = (float*)&deltaframe;
            float *dest = (float*)wsptr;
            for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
                dest[i] += src[i];
        }

        float in = buf[2*i];

        // add aspiration noise
        in = in*wsptr->a_voicing + wsptr->noise()*wsptr->a_aspiration;

        // process complete input signal with f1/nasal filters
        float out = wsptr->res[0].tick(in) + wsptr->res[1].tick(in);

        // differentiate input signal, add frication noise
        float lin = in;
        in = (wsptr->noise()*wsptr->a_frication) + in - wsptr->lastin2;
        wsptr->lastin2 = lin;

        // process diff/fric input signal with f2..f6 and bypass (phase inverted)
        for (int r = 2; r < 7; r++)
            out = wsptr->res[r].tick(in) - out;

        out = in*wsptr->a_bypass - out;

        // high pass filter
        wsptr->hpb1 += 0.012f*(out = out - wsptr->hpb1);
        wsptr->hpb2 += 0.012f*(out = out - wsptr->hpb2);

        // EQ
        out = wsptr->peq1.tick(out) - out;

        buf[2*i] = buf[2*i + 1] = out;
    }
}